

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

void helicsPublicationPublishInteger(HelicsPublication pub,int64_t val,HelicsError *err)

{
  PublicationObject *pPVar1;
  
  pPVar1 = anon_unknown.dwarf_694c0::verifyPublication(pub,err);
  if (pPVar1 != (PublicationObject *)0x0) {
    helics::Publication::publishInt(pPVar1->pubPtr,val);
  }
  return;
}

Assistant:

void helicsPublicationPublishInteger(HelicsPublication pub, int64_t val, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        pubObj->pubPtr->publish(val);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}